

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree_test.cc
# Opt level: O3

iterator __thiscall
phmap::priv::
base_checker<phmap::btree_multimap<std::pair<int,_int>,_std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>_>,_std::multimap<std::pair<int,_int>,_std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>_>_>
::lower_bound(base_checker<phmap::btree_multimap<std::pair<int,_int>,_std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>_>,_std::multimap<std::pair<int,_int>,_std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>_>_>
              *this,key_type *key)

{
  _Rb_tree_iterator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_> checker_iter;
  _Base_ptr p_Var1;
  _Base_ptr p_Var2;
  long lVar3;
  iterator tree_iter;
  iterator iVar5;
  btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_true>_>,_std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_&,_std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_*>
  bVar4;
  
  tree_iter = btree<phmap::priv::map_params<std::pair<int,int>,std::pair<int,int>,phmap::Less<std::pair<int,int>>,std::allocator<std::pair<std::pair<int,int>const,std::pair<int,int>>>,256,true>>
              ::lower_bound<std::pair<int,int>>
                        ((btree<phmap::priv::map_params<std::pair<int,int>,std::pair<int,int>,phmap::Less<std::pair<int,int>>,std::allocator<std::pair<std::pair<int,int>const,std::pair<int,int>>>,256,true>>
                          *)this,key);
  p_Var1 = (this->checker_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  checker_iter._M_node = &(this->checker_)._M_t._M_impl.super__Rb_tree_header._M_header;
  if (p_Var1 != (_Base_ptr)0x0) {
    p_Var2 = checker_iter._M_node;
    do {
      if (((int)p_Var1[1]._M_color < key->first) ||
         ((lVar3 = 0x10, checker_iter._M_node = p_Var1, (int)p_Var1[1]._M_color <= key->first &&
          (*(int *)&p_Var1[1].field_0x4 < key->second)))) {
        lVar3 = 0x18;
        checker_iter._M_node = p_Var2;
      }
      p_Var1 = *(_Base_ptr *)((long)&p_Var1->_M_color + lVar3);
      p_Var2 = checker_iter._M_node;
    } while (p_Var1 != (_Base_ptr)0x0);
  }
  bVar4 = base_checker<phmap::btree_multimap<std::pair<int,int>,std::pair<int,int>,phmap::Less<std::pair<int,int>>,std::allocator<std::pair<std::pair<int,int>const,std::pair<int,int>>>>,std::multimap<std::pair<int,int>,std::pair<int,int>,std::less<std::pair<int,int>>,std::allocator<std::pair<std::pair<int,int>const,std::pair<int,int>>>>>
          ::
          iter_check<phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<std::pair<int,int>,std::pair<int,int>,phmap::Less<std::pair<int,int>>,std::allocator<std::pair<std::pair<int,int>const,std::pair<int,int>>>,256,true>>,std::pair<std::pair<int,int>const,std::pair<int,int>>&,std::pair<std::pair<int,int>const,std::pair<int,int>>*>,std::_Rb_tree_iterator<std::pair<std::pair<int,int>const,std::pair<int,int>>>>
                    ((base_checker<phmap::btree_multimap<std::pair<int,int>,std::pair<int,int>,phmap::Less<std::pair<int,int>>,std::allocator<std::pair<std::pair<int,int>const,std::pair<int,int>>>>,std::multimap<std::pair<int,int>,std::pair<int,int>,std::less<std::pair<int,int>>,std::allocator<std::pair<std::pair<int,int>const,std::pair<int,int>>>>>
                      *)this,tree_iter,checker_iter);
  iVar5.node = bVar4.node;
  iVar5.position = bVar4.position;
  iVar5._12_4_ = bVar4._12_4_;
  return iVar5;
}

Assistant:

iterator lower_bound(const key_type &key) {
        return iter_check(tree_.lower_bound(key), checker_.lower_bound(key));
    }